

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcMiter.c
# Opt level: O0

void Abc_NtkMiterPrepare(Abc_Ntk_t *pNtk1,Abc_Ntk_t *pNtk2,Abc_Ntk_t *pNtkMiter,int fComb,
                        int nPartSize,int fMulti)

{
  int iVar1;
  Abc_Obj_t *pAVar2;
  Abc_Obj_t *pAVar3;
  char *pcVar4;
  Abc_Obj_t *pAVar5;
  Abc_Obj_t *pAVar6;
  int local_44;
  int i;
  Abc_Obj_t *pObjNew;
  Abc_Obj_t *pObj;
  int fMulti_local;
  int nPartSize_local;
  int fComb_local;
  Abc_Ntk_t *pNtkMiter_local;
  Abc_Ntk_t *pNtk2_local;
  Abc_Ntk_t *pNtk1_local;
  
  pAVar2 = Abc_AigConst1(pNtkMiter);
  pAVar3 = Abc_AigConst1(pNtk1);
  (pAVar3->field_6).pCopy = pAVar2;
  pAVar2 = Abc_AigConst1(pNtkMiter);
  pAVar3 = Abc_AigConst1(pNtk2);
  (pAVar3->field_6).pCopy = pAVar2;
  if (fComb == 0) {
    for (local_44 = 0; iVar1 = Abc_NtkPiNum(pNtk1), local_44 < iVar1; local_44 = local_44 + 1) {
      pAVar2 = Abc_NtkPi(pNtk1,local_44);
      pAVar3 = Abc_NtkCreatePi(pNtkMiter);
      (pAVar2->field_6).pCopy = pAVar3;
      pAVar2 = Abc_NtkPi(pNtk2,local_44);
      (pAVar2->field_6).pCopy = pAVar3;
      pcVar4 = Abc_ObjName(pAVar2);
      Abc_ObjAssignName(pAVar3,pcVar4,(char *)0x0);
    }
    if (nPartSize < 1) {
      if (fMulti == 0) {
        pAVar2 = Abc_NtkCreatePo(pNtkMiter);
        Abc_ObjAssignName(pAVar2,"miter",(char *)0x0);
      }
      else {
        for (local_44 = 0; iVar1 = Abc_NtkPoNum(pNtk1), local_44 < iVar1; local_44 = local_44 + 1) {
          Abc_NtkPo(pNtk1,local_44);
          pAVar2 = Abc_NtkCreatePo(pNtkMiter);
          pcVar4 = Abc_ObjName(pAVar2);
          Abc_ObjAssignName(pAVar2,"miter",pcVar4);
        }
      }
    }
    for (local_44 = 0; iVar1 = Vec_PtrSize(pNtk1->vBoxes), local_44 < iVar1; local_44 = local_44 + 1
        ) {
      pAVar2 = Abc_NtkBox(pNtk1,local_44);
      iVar1 = Abc_ObjIsLatch(pAVar2);
      if (iVar1 != 0) {
        pAVar3 = Abc_NtkDupBox(pNtkMiter,pAVar2,0);
        pcVar4 = Abc_ObjName(pAVar2);
        Abc_ObjAssignName(pAVar3,pcVar4,"_1");
        pAVar5 = Abc_ObjFanin0(pAVar3);
        pAVar6 = Abc_ObjFanin0(pAVar2);
        pcVar4 = Abc_ObjName(pAVar6);
        Abc_ObjAssignName(pAVar5,pcVar4,"_1");
        pAVar3 = Abc_ObjFanout0(pAVar3);
        pAVar2 = Abc_ObjFanout0(pAVar2);
        pcVar4 = Abc_ObjName(pAVar2);
        Abc_ObjAssignName(pAVar3,pcVar4,"_1");
      }
    }
    for (local_44 = 0; iVar1 = Vec_PtrSize(pNtk2->vBoxes), local_44 < iVar1; local_44 = local_44 + 1
        ) {
      pAVar2 = Abc_NtkBox(pNtk2,local_44);
      iVar1 = Abc_ObjIsLatch(pAVar2);
      if (iVar1 != 0) {
        pAVar3 = Abc_NtkDupBox(pNtkMiter,pAVar2,0);
        pcVar4 = Abc_ObjName(pAVar2);
        Abc_ObjAssignName(pAVar3,pcVar4,"_2");
        pAVar5 = Abc_ObjFanin0(pAVar3);
        pAVar6 = Abc_ObjFanin0(pAVar2);
        pcVar4 = Abc_ObjName(pAVar6);
        Abc_ObjAssignName(pAVar5,pcVar4,"_2");
        pAVar3 = Abc_ObjFanout0(pAVar3);
        pAVar2 = Abc_ObjFanout0(pAVar2);
        pcVar4 = Abc_ObjName(pAVar2);
        Abc_ObjAssignName(pAVar3,pcVar4,"_2");
      }
    }
  }
  else {
    for (local_44 = 0; iVar1 = Abc_NtkCiNum(pNtk1), local_44 < iVar1; local_44 = local_44 + 1) {
      pAVar2 = Abc_NtkCi(pNtk1,local_44);
      pAVar3 = Abc_NtkCreatePi(pNtkMiter);
      (pAVar2->field_6).pCopy = pAVar3;
      pAVar2 = Abc_NtkCi(pNtk2,local_44);
      (pAVar2->field_6).pCopy = pAVar3;
      pcVar4 = Abc_ObjName(pAVar2);
      Abc_ObjAssignName(pAVar3,pcVar4,(char *)0x0);
    }
    if (nPartSize < 1) {
      if (fMulti == 0) {
        pAVar2 = Abc_NtkCreatePo(pNtkMiter);
        Abc_ObjAssignName(pAVar2,"miter",(char *)0x0);
      }
      else {
        for (local_44 = 0; iVar1 = Abc_NtkCoNum(pNtk1), local_44 < iVar1; local_44 = local_44 + 1) {
          Abc_NtkCo(pNtk1,local_44);
          pAVar2 = Abc_NtkCreatePo(pNtkMiter);
          pcVar4 = Abc_ObjName(pAVar2);
          Abc_ObjAssignName(pAVar2,"miter",pcVar4);
        }
      }
    }
  }
  return;
}

Assistant:

void Abc_NtkMiterPrepare( Abc_Ntk_t * pNtk1, Abc_Ntk_t * pNtk2, Abc_Ntk_t * pNtkMiter, int fComb, int nPartSize, int fMulti )
{
    Abc_Obj_t * pObj, * pObjNew;
    int i;
    // clean the copy field in all objects
//    Abc_NtkCleanCopy( pNtk1 );
//    Abc_NtkCleanCopy( pNtk2 );
    Abc_AigConst1(pNtk1)->pCopy = Abc_AigConst1(pNtkMiter);
    Abc_AigConst1(pNtk2)->pCopy = Abc_AigConst1(pNtkMiter);

    if ( fComb )
    {
        // create new PIs and remember them in the old PIs
        Abc_NtkForEachCi( pNtk1, pObj, i )
        {
            pObjNew = Abc_NtkCreatePi( pNtkMiter );
            // remember this PI in the old PIs
            pObj->pCopy = pObjNew;
            pObj = Abc_NtkCi(pNtk2, i);  
            pObj->pCopy = pObjNew;
            // add name
            Abc_ObjAssignName( pObjNew, Abc_ObjName(pObj), NULL );
        }
        if ( nPartSize <= 0 )
        {
            // create POs
            if ( fMulti )
            {
                Abc_NtkForEachCo( pNtk1, pObj, i )
                {
                    pObjNew = Abc_NtkCreatePo( pNtkMiter );
                    Abc_ObjAssignName( pObjNew, "miter", Abc_ObjName(pObjNew) );
                }

            }
            else
            {
                pObjNew = Abc_NtkCreatePo( pNtkMiter );
                Abc_ObjAssignName( pObjNew, "miter", NULL );
            }
        }
    }
    else
    {
        // create new PIs and remember them in the old PIs
        Abc_NtkForEachPi( pNtk1, pObj, i )
        {
            pObjNew = Abc_NtkCreatePi( pNtkMiter );
            // remember this PI in the old PIs
            pObj->pCopy = pObjNew;
            pObj = Abc_NtkPi(pNtk2, i);  
            pObj->pCopy = pObjNew;
            // add name
            Abc_ObjAssignName( pObjNew, Abc_ObjName(pObj), NULL );
        }
        if ( nPartSize <= 0 )
        {
            // create POs
            if ( fMulti )
            {
                Abc_NtkForEachPo( pNtk1, pObj, i )
                {
                    pObjNew = Abc_NtkCreatePo( pNtkMiter );
                    Abc_ObjAssignName( pObjNew, "miter", Abc_ObjName(pObjNew) );
                }

            }
            else
            {
                pObjNew = Abc_NtkCreatePo( pNtkMiter );
                Abc_ObjAssignName( pObjNew, "miter", NULL );
            }
        }
        // create the latches
        Abc_NtkForEachLatch( pNtk1, pObj, i )
        {
            pObjNew = Abc_NtkDupBox( pNtkMiter, pObj, 0 );
            // add names
            Abc_ObjAssignName( pObjNew, Abc_ObjName(pObj), "_1" );
            Abc_ObjAssignName( Abc_ObjFanin0(pObjNew),  Abc_ObjName(Abc_ObjFanin0(pObj)), "_1" );
            Abc_ObjAssignName( Abc_ObjFanout0(pObjNew), Abc_ObjName(Abc_ObjFanout0(pObj)), "_1" );
        }
        Abc_NtkForEachLatch( pNtk2, pObj, i )
        {
            pObjNew = Abc_NtkDupBox( pNtkMiter, pObj, 0 );
            // add name
            Abc_ObjAssignName( pObjNew, Abc_ObjName(pObj), "_2" );
            Abc_ObjAssignName( Abc_ObjFanin0(pObjNew),  Abc_ObjName(Abc_ObjFanin0(pObj)), "_2" );
            Abc_ObjAssignName( Abc_ObjFanout0(pObjNew), Abc_ObjName(Abc_ObjFanout0(pObj)), "_2" );
        }
    }
}